

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O0

void __thiscall HighsLp::HighsLp(HighsLp *this,HighsLp *param_2)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  HighsNameHash *in_stack_ffffffffffffff68;
  HighsNameHash *in_stack_ffffffffffffff70;
  HighsScale *pHVar2;
  HighsScale *this_00;
  HighsSparseMatrix *in_stack_ffffffffffffff98;
  HighsSparseMatrix *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *__x;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *this_01;
  HighsLpMods *pHVar3;
  HighsLpMods *in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pHVar3 = (HighsLpMods *)(in_RDI + 4);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_01 = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,in_stack_ffffffffffffffb8);
  __x = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 10);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,
             (vector<double,_std::allocator<double>_> *)__x);
  HighsSparseMatrix::HighsSparseMatrix(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  uVar1 = in_RSI[0x1f];
  in_RDI[0x1e] = in_RSI[0x1e];
  in_RDI[0x1f] = uVar1;
  std::__cxx11::string::string((string *)(in_RDI + 0x20),(string *)(in_RSI + 0x20));
  std::__cxx11::string::string((string *)(in_RDI + 0x24),(string *)(in_RSI + 0x24));
  in_RDI[0x28] = in_RSI[0x28];
  this_00 = (HighsScale *)(in_RDI + 0x29);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_01,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__x);
  pHVar2 = (HighsScale *)(in_RDI + 0x2c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_01,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__x);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector(this_01,__x);
  HighsNameHash::HighsNameHash(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  HighsNameHash::HighsNameHash((HighsNameHash *)(in_RDI + 0x39),in_stack_ffffffffffffff68);
  in_RDI[0x40] = in_RSI[0x40];
  HighsScale::HighsScale(this_00,pHVar2);
  *(undefined1 *)(in_RDI + 0x4b) = *(undefined1 *)(in_RSI + 0x4b);
  in_RDI[0x4a] = in_RSI[0x4a];
  HighsLpMods::HighsLpMods(in_stack_ffffffffffffffe0,pHVar3);
  return;
}

Assistant:

HighsLp() { clear(); }